

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O1

void __thiscall
sisl::utility::isosurface::cache_vertex
          (isosurface *this,
          map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          *vMap,int *vIndex,vertex3 *v1,vertex3 *v2,double *iVal1,double *iVal2,double *isoValue,
          double *ss,function *f,bool approximate_gradient)

{
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double *pdVar7;
  undefined8 *puVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ActualDstType actualDst;
  ulong uVar11;
  Index size;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector local_c8;
  vector local_b8;
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  vertex3 local_70;
  pair<const_int,_sisl::vertex3> local_50;
  
  p_Var10 = (vMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(vMap->_M_t)._M_impl.super__Rb_tree_header;
  p_Var9 = &p_Var1->_M_header;
  if (p_Var10 != (_Base_ptr)0x0) {
    do {
      if (*vIndex <= (int)p_Var10[1]._M_color) {
        p_Var9 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < *vIndex];
    } while (p_Var10 != (_Base_ptr)0x0);
  }
  p_Var10 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) && (p_Var10 = p_Var9, *vIndex < (int)p_Var9[1]._M_color)
     ) {
    p_Var10 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var10 == p_Var1) {
    uVar12 = (v1->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    if (((long)uVar12 < 0) ||
       (uVar4 = (v2->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows, (long)uVar4 < 0)) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (uVar12 != uVar4) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>]"
                   );
    }
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    dVar13 = *iVal1;
    dVar14 = *iVal2;
    dVar15 = *isoValue;
    pdVar7 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    if (uVar4 != 0) {
      uStack_90 = 0;
      uStack_80 = 0;
      local_a0 = *iVal1;
      local_98 = *isoValue;
      local_88 = *iVal2;
      free((void *)0x0);
      if (uVar4 == 0) {
        local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        dVar13 = local_a0;
        dVar14 = local_88;
        dVar15 = local_98;
        pdVar7 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
      }
      else {
        if (uVar4 >> 0x3d != 0) {
LAB_00149417:
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = operator_delete;
          __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar7 = (double *)malloc(uVar4 * 8);
        if (uVar4 != 1 && ((ulong)pdVar7 & 0xf) != 0) goto LAB_001493f8;
        dVar13 = local_a0;
        dVar14 = local_88;
        dVar15 = local_98;
        if (pdVar7 == (double *)0x0) goto LAB_00149417;
      }
    }
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar7;
    uVar12 = -(ulong)(ABS(dVar14 - dVar13) < 0.0001);
    dVar13 = (double)(uVar12 & 0x3fe0000000000000 |
                     ~uVar12 & (ulong)((dVar15 - dVar13) / (dVar14 - dVar13)));
    dVar14 = 1.0 - dVar13;
    pdVar7 = (v1->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    pdVar5 = (v2->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    uVar12 = uVar4 & 0x7ffffffffffffffe;
    if (1 < (long)uVar4) {
      uVar11 = 0;
      do {
        pdVar2 = pdVar7 + uVar11;
        dVar15 = pdVar2[1];
        pdVar3 = pdVar5 + uVar11;
        dVar6 = pdVar3[1];
        local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar11] = *pdVar3 * dVar13 + *pdVar2 * dVar14;
        (local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
        uVar11)[1] = dVar6 * dVar13 + dVar15 * dVar14;
        uVar11 = uVar11 + 2;
      } while (uVar11 < uVar12);
    }
    if ((long)uVar12 < (long)uVar4) {
      do {
        local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar12] = pdVar5[uVar12] * dVar13 + pdVar7[uVar12] * dVar14;
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar4
    ;
    free((void *)0x0);
    pdVar7 = (double *)malloc(0x18);
    if (((ulong)pdVar7 & 0xf) != 0) {
LAB_001493f8:
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar7 == (double *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = operator_delete;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar7;
    vertex3::vertex3(&local_70,&local_c8,&local_b8);
    local_50.first = *vIndex;
    vertex3::vertex3(&local_50.second,&local_70);
    std::
    _Rb_tree<int,std::pair<int_const,sisl::vertex3>,std::_Select1st<std::pair<int_const,sisl::vertex3>>,std::less<int>,std::allocator<std::pair<int_const,sisl::vertex3>>>
    ::_M_insert_unique<std::pair<int_const,sisl::vertex3>>
              ((_Rb_tree<int,std::pair<int_const,sisl::vertex3>,std::_Select1st<std::pair<int_const,sisl::vertex3>>,std::less<int>,std::allocator<std::pair<int_const,sisl::vertex3>>>
                *)vMap,&local_50);
    free(local_50.second.n.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_50.second.p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_70.n.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    free(local_70.p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  return;
}

Assistant:

inline void cache_vertex(
                    std::map<int, sisl::vertex3 > *vMap,
                    const int &vIndex,
                    const vertex3 &v1,
                    const vertex3 &v2,
                    const double &iVal1,
                    const double &iVal2,
                    const double &isoValue,
                    const double &ss,
                    sisl::function *f,
                    bool approximate_gradient = false) {

                #pragma omp critical(cache_vertex)
                {
                    if(vMap->find(vIndex) == vMap->end()) {
                        double interpolate = (isoValue -iVal1)/(iVal2-iVal1);
                        if(fabs(iVal2-iVal1) < 0.0001)
                            interpolate = 0.5;
                        sisl::vector vnew = v1.p*(1.-interpolate) + v2.p*(interpolate);
                        sisl::vector na(3);// = f->grad(vnew);

                        vMap->insert(
                            {
                                vIndex,
                                sisl::vertex3(vnew, na)
                            });
                    }
                }
            }